

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O3

bool __thiscall
SpiAnalyzer::WouldAdvancingTheClockToggleEnable
          (SpiAnalyzer *this,bool add_disable_frame,U64 *disable_frame)

{
  char cVar1;
  bool bVar2;
  BitState BVar3;
  ulonglong uVar4;
  FrameV2 frame_v2_end_of_transaction;
  FrameV2 aFStack_28 [8];
  
  if (this->mEnable == (AnalyzerChannelData *)0x0) {
LAB_001067a6:
    bVar2 = false;
  }
  else {
    cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (((cVar1 == '\0') &&
        (BVar3 = AnalyzerChannelData::GetBitState(),
        BVar3 == ((this->mSettings)._M_ptr)->mEnableActiveState)) &&
       (cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData(), cVar1 != '\0')) {
      uVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
      cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                        ((ulonglong)this->mClock);
      if (cVar1 != '\0') goto LAB_00106740;
      if (!add_disable_frame) goto LAB_001067e1;
      FrameV2::FrameV2(aFStack_28);
      AnalyzerResults::AddFrameV2
                ((FrameV2 *)(this->mResults)._M_ptr,(char *)aFStack_28,0x10a01e,uVar4);
    }
    else {
LAB_00106740:
      AnalyzerChannelData::GetSampleOfNextEdge();
      cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                        ((ulonglong)this->mEnable);
      if (cVar1 == '\0') goto LAB_001067a6;
      uVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
      if (!add_disable_frame) {
LAB_001067e1:
        if (disable_frame == (U64 *)0x0) {
          return true;
        }
        *disable_frame = uVar4;
        return true;
      }
      FrameV2::FrameV2(aFStack_28);
      AnalyzerResults::AddFrameV2
                ((FrameV2 *)(this->mResults)._M_ptr,(char *)aFStack_28,0x10a01e,uVar4);
    }
    FrameV2::~FrameV2(aFStack_28);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SpiAnalyzer::WouldAdvancingTheClockToggleEnable( bool add_disable_frame, U64* disable_frame )
{
    if( mEnable == NULL )
        return false;

    auto log_disable_event = [&]( U64 enable_edge ) {
        if( add_disable_frame )
        {
            FrameV2 frame_v2_end_of_transaction;
            mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", enable_edge, enable_edge + 1 );
        }
        else if( disable_frame != nullptr )
        {
            *disable_frame = enable_edge;
        }
    };

    // if the enable is currently active, and there are no more clock transitions in the capture, attempt to capture the final disable event
    if( !mClock->DoMoreTransitionsExistInCurrentData() && mEnable->GetBitState() == mSettings->mEnableActiveState )
    {
        if( mEnable->DoMoreTransitionsExistInCurrentData() )
        {
            U64 next_enable_edge = mEnable->GetSampleOfNextEdge();
            // double check that the clock line actually processed all samples up to the next enable edge.
            // double check is required becase data is getting processed while we're running, it's possible more has already become
            // available.
            if( !mClock->WouldAdvancingToAbsPositionCauseTransition( next_enable_edge ) )
            {
                log_disable_event( next_enable_edge );
                return true;
            }
        }
    }

    U64 next_edge = mClock->GetSampleOfNextEdge();
    bool enable_will_toggle = mEnable->WouldAdvancingToAbsPositionCauseTransition( next_edge );

    if( enable_will_toggle )
    {
        U64 enable_edge = mEnable->GetSampleOfNextEdge();
        log_disable_event( enable_edge );
    }

    if( enable_will_toggle == false )
        return false;
    else
        return true;
}